

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IOBoard.cpp
# Opt level: O0

void __thiscall IOBoard::writeBoardIntoFile(IOBoard *this,Board *board,string *fileName)

{
  byte bVar1;
  bool bVar2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  reference puVar3;
  size_t sVar4;
  ostream *poVar5;
  const_iterator cStack_250;
  uint value;
  const_iterator __end1;
  const_iterator __begin1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *values;
  long local_220;
  ofstream ofs;
  string *fileName_local;
  Board *board_local;
  IOBoard *this_local;
  
  std::ofstream::ofstream(&local_220,fileName,0x10);
  bVar1 = std::ios::operator!((ios *)((long)&local_220 + *(long *)(local_220 + -0x18)));
  if ((bVar1 & 1) == 0) {
    this_00 = Board::getBoardValues(board);
    __end1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(this_00);
    cStack_250 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(this_00);
    while (bVar2 = __gnu_cxx::
                   operator==<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                             (&__end1,&stack0xfffffffffffffdb0), ((bVar2 ^ 0xffU) & 1) != 0) {
      puVar3 = __gnu_cxx::
               __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
               ::operator*(&__end1);
      poVar5 = (ostream *)std::ostream::operator<<(&local_220,(uint)*puVar3);
      std::operator<<(poVar5,',');
      __gnu_cxx::
      __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::operator++(&__end1);
    }
    sVar4 = Board::getSizeInt(board);
    poVar5 = (ostream *)std::ostream::operator<<(&local_220,sVar4);
    std::operator<<(poVar5,'\n');
    std::ofstream::close();
  }
  std::ofstream::~ofstream(&local_220);
  return;
}

Assistant:

void IOBoard::writeBoardIntoFile( const Board& board, const std::string& fileName )
{
    std::ofstream ofs( fileName );
    if ( !ofs )
    {
        return;
    }

    const auto& values = board.getBoardValues();
    for ( uint value : values )
    {
        ofs << value << ',';
    }
    ofs << board.getSizeInt() << '\n';
    ofs.close();
}